

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_str.c
# Opt level: O1

char * sr_stat_str(SRunner *sr)

{
  uint uVar1;
  int iVar2;
  TestStats *pTVar3;
  char *pcVar4;
  ulong uVar5;
  
  pTVar3 = sr->stats;
  uVar1 = pTVar3->n_failed;
  if ((uVar1 == 0) && (pTVar3->n_errors == 0)) {
    uVar5 = 100;
  }
  else {
    iVar2 = pTVar3->n_checked;
    if (iVar2 == 0) {
      uVar5 = 0;
    }
    else {
      uVar5 = (ulong)(uint)(int)(((float)(int)(iVar2 - (pTVar3->n_errors + uVar1)) / (float)iVar2) *
                                100.0);
    }
  }
  pcVar4 = ck_strdup_printf("%d%%: Checks: %d, Failures: %d, Errors: %d",uVar5,
                            (ulong)(uint)pTVar3->n_checked,(ulong)uVar1,
                            (ulong)(uint)pTVar3->n_errors);
  return pcVar4;
}

Assistant:

char *sr_stat_str(SRunner * sr)
{
    char *str;
    TestStats *ts;

    ts = sr->stats;

    str = ck_strdup_printf("%d%%: Checks: %d, Failures: %d, Errors: %d",
                           percent_passed(ts), ts->n_checked, ts->n_failed,
                           ts->n_errors);

    return str;
}